

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O1

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,33,1,0,33,1>>
               (Matrix<double,_33,_1,_0,_33,_1> *result,
               ChIntegrable3D<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChQuadratureTables *pCVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  ActualDstType actualDst;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  pointer pvVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Matrix<double,_33,_1,_0,_33,_1> val;
  ChQuadratureTables *local_190;
  pointer local_188;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  double local_38;
  
  pCVar8 = GetStaticTables();
  uVar15 = ((long)(pCVar8->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pCVar8->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar15 < (uint)order) {
    local_190 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(local_190,order,order);
    ChQuadratureTables::PrintTables(local_190);
    local_188 = (local_190->Weight).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pvVar19 = (local_190->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_190 = GetStaticTables();
    pvVar19 = (local_190->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
    local_188 = (local_190->Weight).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
  }
  dVar4 = (Xb - Xa) * 0.5;
  dVar5 = (Yb - Ya) * 0.5;
  dVar6 = (Zb - Za) * 0.5;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[1];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
         array[0] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[1]
       = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[3];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[2]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
         array[2] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[3]
       = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[5];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[4]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
         array[4] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[5]
       = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[7];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[6]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
         array[6] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[7]
       = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[9];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[8]
       = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
         array[8] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[9]
       = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0xb];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [10] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
         array[10] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xb] = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0xd];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xc] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0xc] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xd] = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0xf];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xe] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0xe] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xf] = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x11];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x10] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array[0x10] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x11] = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x13];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x12] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array[0x12] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x13] = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x15];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x14] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array[0x14] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x15] = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x17];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x16] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array[0x16] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x17] = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x19];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x18] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array[0x18] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x19] = dVar7 * 0.0;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x1b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1a] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array[0x1a] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1b] = dVar7 * 0.0;
  auVar20._0_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x1c] * 0.0;
  auVar20._8_8_ =
       (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
       array[0x1d] * 0.0;
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
   + 0x1c) = auVar20;
  dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x1f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1e] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array[0x1e] * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1f] = dVar7 * 0.0;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x20] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data
           .array[0x20] * 0.0;
  if ((pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish !=
      (pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar16 = 0;
    do {
      if ((pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar13 = 0;
        do {
          lVar9 = *(long *)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data;
          lVar11 = (long)(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - lVar9;
          if (lVar11 != 0) {
            uVar12 = lVar11 >> 3;
            uVar17 = 1;
            uVar18 = 0;
            do {
              uVar14 = uVar16;
              if ((uVar12 <= uVar16) || (uVar14 = uVar13, uVar12 <= uVar13)) {
LAB_006f8c4d:
                uVar10 = std::__throw_out_of_range_fmt
                                   ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                    ,uVar14);
                operator_delete(pvVar19,0x30);
                _Unwind_Resume(uVar10);
              }
              auVar21._8_8_ = 0;
              auVar21._0_8_ = *(ulong *)(lVar9 + uVar16 * 8);
              auVar22._8_8_ = 0;
              auVar22._0_8_ = (Xa + Xb) * 0.5;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = dVar4;
              auVar20 = vfmadd132sd_fma(auVar21,auVar22,auVar1);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *(ulong *)(lVar9 + uVar13 * 8);
              auVar25._8_8_ = 0;
              auVar25._0_8_ = (Ya + Yb) * 0.5;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = dVar5;
              auVar1 = vfmadd132sd_fma(auVar23,auVar25,auVar2);
              auVar26._8_8_ = 0;
              auVar26._0_8_ = *(ulong *)(lVar9 + uVar18 * 8);
              auVar27._8_8_ = 0;
              auVar27._0_8_ = (Za + Zb) * 0.5;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = dVar6;
              auVar2 = vfmadd132sd_fma(auVar26,auVar27,auVar3);
              (*integrand->_vptr_ChIntegrable3D[2])
                        (auVar20._0_8_,auVar1._0_8_,auVar2._0_8_,integrand,&local_138);
              lVar9 = *(long *)&(local_188->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl;
              uVar12 = (long)(local_188->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_finish - lVar9 >> 3;
              uVar14 = uVar16;
              if ((uVar12 <= uVar16) ||
                 ((uVar14 = uVar13, uVar12 <= uVar13 || (uVar14 = uVar18, uVar12 <= uVar18))))
              goto LAB_006f8c4d;
              dVar7 = *(double *)(lVar9 + uVar16 * 8) * *(double *)(lVar9 + uVar13 * 8) *
                      *(double *)(lVar9 + uVar18 * 8);
              auVar24._8_8_ = dVar7;
              auVar24._0_8_ = dVar7;
              local_138 = dVar7 * local_138;
              dStack_130 = dVar7 * dStack_130;
              local_128 = dVar7 * local_128;
              dStack_120 = dVar7 * dStack_120;
              local_118 = dVar7 * local_118;
              dStack_110 = dVar7 * dStack_110;
              local_108 = dVar7 * local_108;
              dStack_100 = dVar7 * dStack_100;
              local_f8 = dVar7 * local_f8;
              dStack_f0 = dVar7 * dStack_f0;
              local_e8 = dVar7 * local_e8;
              dStack_e0 = dVar7 * dStack_e0;
              local_d8 = dVar7 * local_d8;
              dStack_d0 = dVar7 * dStack_d0;
              local_c8 = dVar7 * local_c8;
              dStack_c0 = dVar7 * dStack_c0;
              local_b8 = dVar7 * local_b8;
              dStack_b0 = dVar7 * dStack_b0;
              local_a8 = dVar7 * local_a8;
              dStack_a0 = dVar7 * dStack_a0;
              local_98 = dVar7 * local_98;
              dStack_90 = dVar7 * dStack_90;
              local_88 = dVar7 * local_88;
              dStack_80 = dVar7 * dStack_80;
              local_78 = dVar7 * local_78;
              dStack_70 = dVar7 * dStack_70;
              local_68 = dVar7 * local_68;
              dStack_60 = dVar7 * dStack_60;
              local_58 = vmulpd_avx512vl(auVar24,local_58);
              local_48 = dVar7 * local_48;
              dStack_40 = dVar7 * dStack_40;
              local_38 = dVar7 * local_38;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[1];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0] =
                   local_138 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[1] = dStack_130 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[3];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[2] =
                   local_128 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[2];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[3] = dStack_120 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[5];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[4] =
                   local_118 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[4];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[5] = dStack_110 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[7];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[6] =
                   local_108 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[6];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[7] = dStack_100 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[9];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[8] =
                   local_f8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[8];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[9] = dStack_f0 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0xb];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[10] =
                   local_e8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[10];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0xb] = dStack_e0 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0xd];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0xc] =
                   local_d8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0xc];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0xd] = dStack_d0 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0xf];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0xe] =
                   local_c8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0xe];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0xf] = dStack_c0 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0x11];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x10] =
                   local_b8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x10];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x11] = dStack_b0 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0x13];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x12] =
                   local_a8 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x12];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x13] = dStack_a0 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0x15];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x14] =
                   local_98 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x14];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x15] = dStack_90 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0x17];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x16] =
                   local_88 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x16];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x17] = dStack_80 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0x19];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x18] =
                   local_78 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x18];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x19] = dStack_70 + dVar7;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0x1b];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x1a] =
                   local_68 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x1a];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x1b] = dStack_60 + dVar7;
              auVar20 = vaddpd_avx512vl(local_58,*(undefined1 (*) [16])
                                                  ((result->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>
                                                  ).m_storage.m_data.array + 0x1c));
              *(undefined1 (*) [16])
               ((result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                m_data.array + 0x1c) = auVar20;
              dVar7 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                      m_storage.m_data.array[0x1f];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x1e] =
                   local_48 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x1e];
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x1f] = dStack_40 + dVar7;
              (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
              m_data.array[0x20] =
                   local_38 +
                   (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x20];
              uVar18 = (ulong)uVar17;
              lVar9 = *(long *)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data;
              uVar12 = (long)(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish - lVar9 >> 3;
              uVar17 = uVar17 + 1;
            } while (uVar18 < uVar12);
          }
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (uVar13 < (ulong)((long)(pvVar19->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_finish -
                                  *(long *)&(pvVar19->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data >> 3));
      }
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (uVar16 < (ulong)((long)(pvVar19->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              *(long *)&(pvVar19->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data >> 3));
  }
  dVar6 = dVar5 * dVar4 * dVar6;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[1];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0]
       = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[0];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[1]
       = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[3];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[2]
       = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[2];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[3]
       = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[5];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[4]
       = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[4];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[5]
       = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[7];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[6]
       = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[6];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[7]
       = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[9];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[8]
       = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[8];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[9]
       = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0xb];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [10] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.
                 m_data.array[10];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xb] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0xd];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xc] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage
                  .m_data.array[0xc];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xd] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0xf];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xe] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage
                  .m_data.array[0xe];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0xf] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x11];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x10] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x10];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x11] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x13];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x12] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x12];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x13] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x15];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x14] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x14];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x15] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x17];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x16] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x16];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x17] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x19];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x18] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x18];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x19] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x1b];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1a] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x1a];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1b] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x1d];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1c] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x1c];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1d] = dVar6 * dVar4;
  dVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
          array[0x1f];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1e] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x1e];
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x1f] = dVar6 * dVar4;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array
  [0x20] = dVar6 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).
                   m_storage.m_data.array[0x20];
  if (uVar15 < (uint)order) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_190->Lroots);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_190->Weight);
    operator_delete(local_190,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }